

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFMFileReader.cpp
# Opt level: O0

EStatusCode __thiscall PFMFileReader::ReadDWord(PFMFileReader *this,DWORD *outDWORD)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte local_21;
  DWORD *pDStack_20;
  Byte buffer;
  DWORD *outDWORD_local;
  PFMFileReader *this_local;
  
  *outDWORD = 0;
  if (this->mInternalReadStatus != eFailure) {
    pDStack_20 = outDWORD;
    outDWORD_local = (DWORD *)this;
    iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mReaderStream,&local_21,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      this->mInternalReadStatus = eFailure;
      return eFailure;
    }
    *pDStack_20 = (ulong)local_21;
    iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mReaderStream,&local_21,1);
    if (CONCAT44(extraout_var_00,iVar1) != 1) {
      this->mInternalReadStatus = eFailure;
      return eFailure;
    }
    *pDStack_20 = (ulong)local_21 << 8 | *pDStack_20;
    iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mReaderStream,&local_21,1);
    if (CONCAT44(extraout_var_01,iVar1) != 1) {
      this->mInternalReadStatus = eFailure;
      return eFailure;
    }
    *pDStack_20 = (ulong)local_21 << 0x10 | *pDStack_20;
    iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mReaderStream,&local_21,1);
    if (CONCAT44(extraout_var_02,iVar1) != 1) {
      this->mInternalReadStatus = eFailure;
      return eFailure;
    }
    *pDStack_20 = (ulong)local_21 << 0x18 | *pDStack_20;
  }
  return this->mInternalReadStatus;
}

Assistant:

EStatusCode PFMFileReader::ReadDWord(DWORD& outDWORD)
{
	IOBasicTypes::Byte buffer;
	outDWORD = 0;

	if(mInternalReadStatus != PDFHummus::eFailure)
	{
		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD = buffer;

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 8);

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 16);

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 24);
	}

	return mInternalReadStatus;
}